

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O3

Iter<(anonymous_namespace)::ByTxHash> __thiscall
TxRequestTracker::Impl::Erase<(anonymous_namespace)::ByTxHash>
          (Impl *this,Iter<(anonymous_namespace)::ByTxHash> it)

{
  long *plVar1;
  ulong uVar2;
  __hash_code __code;
  incrementable_type nrv;
  _Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false> __position;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  *poVar3;
  long in_FS_OFFSET;
  impl_pointer xi;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(ulong *)((long)&((it.node)->
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                            ).
                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                            .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                    + 0x28);
  for (__position._M_cur =
            (__node_type *)
            (this->m_peerinfo)._M_h._M_buckets[uVar2 % (this->m_peerinfo)._M_h._M_bucket_count]->
            _M_nxt; *(ulong *)((long)__position._M_cur + 8) != uVar2;
      __position._M_cur = *__position._M_cur) {
  }
  *(long *)((long)__position._M_cur + 0x18) =
       *(long *)((long)__position._M_cur + 0x18) -
       (ulong)((uint)((ulong)*(undefined8 *)
                              ((long)&((it.node)->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      ).
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) >> 0x3d) == 4);
  *(long *)((long)__position._M_cur + 0x20) =
       *(long *)((long)__position._M_cur + 0x20) -
       (ulong)((uint)((ulong)*(undefined8 *)
                              ((long)&((it.node)->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      ).
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) >> 0x3d) == 3);
  plVar1 = (long *)((long)__position._M_cur + 0x10);
  *plVar1 = *plVar1 + -1;
  if (*plVar1 == 0) {
    std::
    unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
    ::erase(&this->m_peerinfo,(iterator)__position._M_cur);
  }
  local_28 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
              *)&(it.node)->
                 super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  ;
  boost::multi_index::detail::
  ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>::
  increment((pointer *)&local_28);
  poVar3 = local_28;
  if (local_28 !=
      (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
       *)0x0) {
    poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
              *)((long)&local_28[-1].
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        .
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                0x18);
  }
  boost::multi_index::
  multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
  ::erase_(&this->m_index,(final_node_type *)it.node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (Iter<(anonymous_namespace)::ByTxHash>)poVar3;
  }
  __stack_chk_fail();
}

Assistant:

Iter<Tag> Erase(Iter<Tag> it)
    {
        auto peerit = m_peerinfo.find(it->m_peer);
        peerit->second.m_completed -= it->GetState() == State::COMPLETED;
        peerit->second.m_requested -= it->GetState() == State::REQUESTED;
        if (--peerit->second.m_total == 0) m_peerinfo.erase(peerit);
        return m_index.get<Tag>().erase(it);
    }